

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

transformations_t *
opengv::absolute_pose::gp3p(AbsoluteAdapterBase *adapter,vector<int,_std::allocator<int>_> *indices)

{
  const_reference pvVar1;
  vector<int,_std::allocator<int>_> *in_RDX;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RSI;
  transformations_t *in_RDI;
  rotation_t R;
  size_t i;
  Matrix3d p;
  Matrix3d v;
  Matrix3d f;
  transformations_t *solutions;
  transformations_t *in_stack_00009590;
  Matrix3d *in_stack_00009598;
  Matrix3d *in_stack_000095a0;
  Matrix3d *in_stack_000095a8;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd10;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd18;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd20;
  undefined1 local_280 [72];
  undefined1 local_238 [176];
  undefined1 local_188 [120];
  undefined1 local_110 [24];
  ulong local_f8;
  vector<int,_std::allocator<int>_> *local_18;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x71d2d9);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x71d2e6);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x71d2f3);
  for (local_f8 = 0; local_f8 < 3; local_f8 = local_f8 + 1) {
    other = local_10;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](local_18,local_f8);
    (**(code **)(*(long *)other + 0x10))(local_110,other,(long)*pvVar1);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffd20,
               (Index)in_stack_fffffffffffffd18);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)in_stack_fffffffffffffd10,
               other);
    in_stack_fffffffffffffd10 = local_10;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](local_18,local_f8);
    (**(code **)(*(long *)in_stack_fffffffffffffd10 + 0x28))
              (local_188,in_stack_fffffffffffffd10,(long)*pvVar1);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffd20,
               (Index)in_stack_fffffffffffffd18);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffd20,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               in_stack_fffffffffffffd18);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffd20,
               (Index)in_stack_fffffffffffffd18);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)in_stack_fffffffffffffd10,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                *)other);
    in_stack_fffffffffffffd18 = local_10;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](local_18,local_f8);
    (**(code **)(*(long *)in_stack_fffffffffffffd18 + 0x20))
              (local_238,in_stack_fffffffffffffd18,(long)*pvVar1);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffd20,
               (Index)in_stack_fffffffffffffd18);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)in_stack_fffffffffffffd10,
               other);
    in_stack_fffffffffffffd20 = local_10;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](local_18,local_f8);
    (**(code **)(*(long *)in_stack_fffffffffffffd20 + 0x30))
              (local_280,in_stack_fffffffffffffd20,(long)*pvVar1);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffd20,
               (Index)in_stack_fffffffffffffd18);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)in_stack_fffffffffffffd10,
               other);
  }
  std::
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            *)0x71d50a);
  modules::gp3p_main(in_stack_000095a8,in_stack_000095a0,in_stack_00009598,in_stack_00009590);
  return in_RDI;
}

Assistant:

opengv::transformations_t
opengv::absolute_pose::gp3p(
    const AbsoluteAdapterBase & adapter,
    const std::vector<int> & indices )
{
  assert(indices.size()>2);

  Eigen::Matrix3d f;
  Eigen::Matrix3d v;
  Eigen::Matrix3d p;

  for(size_t i = 0; i < 3; i++)
  {
    f.col(i) = adapter.getBearingVector(indices[i]);
    rotation_t R = adapter.getCamRotation(indices[i]);
    
    //unrotate the bearingVectors already so the camera rotation doesn't appear
    //in the problem
    f.col(i) = R * f.col(i);
    v.col(i) = adapter.getCamOffset(indices[i]);
    p.col(i) = adapter.getPoint(indices[i]);
  }

  transformations_t solutions;
  modules::gp3p_main(f,v,p,solutions);

  return solutions;
}